

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O2

wstring * GetTitleAndDeveloperFromSpecCommandArgument
                    (wstring *__return_storage_ptr__,wifstream *stream,wstring *command_argument)

{
  int iVar1;
  runtime_error *this;
  int iVar2;
  bool bVar3;
  wstring line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)command_argument);
  iVar2 = 2;
  while( true ) {
    iVar1 = std::wistream::get();
    std::wistream::unget();
    if (iVar1 != 0x20) {
      return __return_storage_ptr__;
    }
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) break;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = L'\0';
    std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((wistream *)stream,(wstring *)&line);
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    std::__cxx11::wstring::find_first_not_of((wchar_t)&line,0x20);
    std::__cxx11::wstring::substr((ulong)&local_70,(ulong)&line);
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
    std::__cxx11::wstring::~wstring((wstring *)&local_70);
    std::__cxx11::wstring::~wstring((wstring *)&line);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_50,3);
  std::operator+(&local_70,"Title and developer can not be more than ",&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 &local_70," lines");
  std::runtime_error::runtime_error(this,(string *)&line);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::wstring GetTitleAndDeveloperFromSpecCommandArgument(std::wifstream& stream, const std::wstring& command_argument) {
    std::wstring title_and_developer = command_argument;
    constexpr int max_lines = 3;
    int current_line = 1;

    while (true) {
        wchar_t first_char = stream.get();
        stream.unget();
        if (first_char != L' ') {
            return title_and_developer;
        }

        if (current_line++ == max_lines) {
            throw std::runtime_error("Title and developer can not be more than " + std::to_string(max_lines) + " lines");
        }

        std::wstring line;
        std::getline(stream, line);

        title_and_developer += '\n';
        title_and_developer += line.substr(line.find_first_not_of(L' '), line.size());
    }
}